

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::zeMemFreeEpilogue
          (ZEbasic_leakChecker *this,ze_context_handle_t param_1,void *param_2,ze_result_t result)

{
  allocator local_49;
  string local_48 [36];
  ze_result_t local_24;
  void *pvStack_20;
  ze_result_t result_local;
  void *param_2_local;
  ze_context_handle_t param_1_local;
  ZEbasic_leakChecker *this_local;
  
  local_24 = result;
  if (result == ZE_RESULT_SUCCESS) {
    pvStack_20 = param_2;
    param_2_local = param_1;
    param_1_local = (ze_context_handle_t)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"zeMemFree",&local_49);
    countFunctionCall(this,(string *)local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return local_24;
}

Assistant:

ze_result_t basic_leakChecker::ZEbasic_leakChecker::zeMemFreeEpilogue(ze_context_handle_t, void *, ze_result_t result) {
        if (result == ZE_RESULT_SUCCESS) {
            countFunctionCall("zeMemFree");
        }
        return result;
    }